

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int nghttp2_session_set_local_window_size
              (nghttp2_session *session,uint8_t flags,int32_t stream_id,int32_t window_size)

{
  nghttp2_stream *stream_00;
  int rv;
  nghttp2_stream *stream;
  int32_t window_size_increment;
  int32_t window_size_local;
  int32_t stream_id_local;
  uint8_t flags_local;
  nghttp2_session *session_local;
  
  if (window_size < 0) {
    session_local._4_4_ = -0x1f5;
  }
  else {
    stream._4_4_ = window_size;
    window_size_increment = stream_id;
    window_size_local._3_1_ = flags;
    _stream_id_local = session;
    if (stream_id == 0) {
      stream._0_4_ = window_size - session->local_window_size;
      if ((int)stream == 0) {
        session_local._4_4_ = 0;
      }
      else if ((int)stream < 0) {
        session_local._4_4_ =
             nghttp2_adjust_local_window_size
                       (&session->local_window_size,&session->recv_window_size,
                        &session->recv_reduction,(int32_t *)&stream);
      }
      else {
        session_local._4_4_ =
             nghttp2_increase_local_window_size
                       (&session->local_window_size,&session->recv_window_size,
                        &session->recv_reduction,(int32_t *)&stream);
        if (session_local._4_4_ == 0) {
          if ((int)stream < 1) {
            session_local._4_4_ =
                 nghttp2_session_update_recv_connection_window_size(_stream_id_local,0);
          }
          else {
            session_local._4_4_ =
                 nghttp2_session_add_window_update
                           (_stream_id_local,'\0',window_size_increment,(int)stream);
          }
        }
      }
    }
    else {
      stream_00 = nghttp2_session_get_stream(session,stream_id);
      if (stream_00 == (nghttp2_stream *)0x0) {
        session_local._4_4_ = 0;
      }
      else {
        stream._0_4_ = stream._4_4_ - stream_00->local_window_size;
        if ((int)stream == 0) {
          session_local._4_4_ = 0;
        }
        else if ((int)stream < 0) {
          session_local._4_4_ =
               nghttp2_adjust_local_window_size
                         (&stream_00->local_window_size,&stream_00->recv_window_size,
                          &stream_00->recv_reduction,(int32_t *)&stream);
        }
        else {
          session_local._4_4_ =
               nghttp2_increase_local_window_size
                         (&stream_00->local_window_size,&stream_00->recv_window_size,
                          &stream_00->recv_reduction,(int32_t *)&stream);
          if (session_local._4_4_ == 0) {
            if ((int)stream < 1) {
              session_local._4_4_ =
                   nghttp2_session_update_recv_stream_window_size(_stream_id_local,stream_00,0,1);
            }
            else {
              session_local._4_4_ =
                   nghttp2_session_add_window_update
                             (_stream_id_local,'\0',window_size_increment,(int)stream);
            }
          }
        }
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_set_local_window_size(nghttp2_session *session,
                                          uint8_t flags, int32_t stream_id,
                                          int32_t window_size) {
  int32_t window_size_increment;
  nghttp2_stream *stream;
  int rv;
  (void)flags;

  if (window_size < 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (stream_id == 0) {
    window_size_increment = window_size - session->local_window_size;

    if (window_size_increment == 0) {
      return 0;
    }

    if (window_size_increment < 0) {
      return nghttp2_adjust_local_window_size(
          &session->local_window_size, &session->recv_window_size,
          &session->recv_reduction, &window_size_increment);
    }

    rv = nghttp2_increase_local_window_size(
        &session->local_window_size, &session->recv_window_size,
        &session->recv_reduction, &window_size_increment);

    if (rv != 0) {
      return rv;
    }

    if (window_size_increment > 0) {
      return nghttp2_session_add_window_update(session, 0, stream_id,
                                               window_size_increment);
    }

    return nghttp2_session_update_recv_connection_window_size(session, 0);
  } else {
    stream = nghttp2_session_get_stream(session, stream_id);

    if (stream == NULL) {
      return 0;
    }

    window_size_increment = window_size - stream->local_window_size;

    if (window_size_increment == 0) {
      return 0;
    }

    if (window_size_increment < 0) {
      return nghttp2_adjust_local_window_size(
          &stream->local_window_size, &stream->recv_window_size,
          &stream->recv_reduction, &window_size_increment);
    }

    rv = nghttp2_increase_local_window_size(
        &stream->local_window_size, &stream->recv_window_size,
        &stream->recv_reduction, &window_size_increment);

    if (rv != 0) {
      return rv;
    }

    if (window_size_increment > 0) {
      return nghttp2_session_add_window_update(session, 0, stream_id,
                                               window_size_increment);
    }

    return nghttp2_session_update_recv_stream_window_size(session, stream, 0,
                                                          1);
  }
}